

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O0

double xc_bessel_I0(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double r;
  double y;
  double local_18;
  
  local_18 = 0.0;
  dVar3 = ABS(in_XMM0_Qa);
  dVar1 = sqrt(2.220446049250313e-16);
  if (dVar1 * 2.0 <= ABS(in_XMM0_Qa)) {
    if (3.0 < dVar3) {
      dVar1 = dVar3;
      dVar2 = log(1.79769313486232e+308);
      if (dVar2 - 1.0 <= dVar3) {
        fprintf(_stderr,"Overflow in bessel_I0\n");
      }
      else {
        local_18 = exp(dVar1);
        dVar3 = xc_bessel_I0_scaled(dVar1);
        local_18 = local_18 * dVar3;
      }
    }
    else {
      local_18 = xc_cheb_eval((dVar3 * dVar3) / 4.5 - 1.0,bi0_data,0xc);
      local_18 = local_18 + 2.75;
    }
  }
  else {
    local_18 = 1.0;
  }
  return local_18;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I0(const double x)
{
  double y = fabs(x), r = 0.0;

  if(y < 2.0*SQRT_DBL_EPSILON)
    r = 1.0;
  else if(y <= 3.0)
    r = 2.75 + xc_cheb_eval(y*y/4.5 - 1.0, bi0_data, 12);
  else if(y < LOG_DBL_MAX - 1.0)
    r = exp(y) * xc_bessel_I0_scaled(x);
  else {
#ifndef HAVE_CUDA
    fprintf(stderr, "Overflow in bessel_I0\n");
#endif
  }

  return r;
}